

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<std::__cxx11::string_const&>::operator<=
          (result *__return_storage_ptr__,expression_lhs<std::__cxx11::string_const&> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  lest *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  bool local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs_local;
  expression_lhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_local;
  
  local_20 = rhs;
  rhs_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local = (expression_lhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)__return_storage_ptr__;
  local_21 = std::operator<=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              this,rhs);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"<=",&local_69);
  to_string<std::__cxx11::string,std::__cxx11::string>(&local_48,this_00,&local_68,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

result operator>=( R const & rhs ) { return result{ lhs >= rhs, to_string( lhs, ">=", rhs ) }; }